

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O2

size_t ans_reorder_fold_compress<7u>(uint8_t *dst,size_t dstCapacity,uint32_t *src,size_t srcSize)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  array<unsigned_long,_4UL> states;
  ans_reorder_fold_encode<7U> ans_frame;
  long *local_d8;
  uint64_t local_d0;
  uint64_t uStack_c8;
  uint64_t uStack_c0;
  uint64_t uStack_b8;
  uint8_t *local_b0;
  ans_reorder_fold_encode<7U> local_a8;
  
  ans_reorder_fold_encode<7U>::create(&local_a8,src,srcSize);
  local_d8 = (long *)dst;
  local_b0 = dst;
  ans_reorder_fold_encode<7U>::serialize(&local_a8,(uint8_t **)&local_d8);
  local_d0 = local_a8.lower_bound;
  uStack_c8 = local_a8.lower_bound;
  uStack_c0 = local_a8.lower_bound;
  uStack_b8 = local_a8.lower_bound;
  for (lVar2 = 0; -lVar2 != (ulong)((uint)srcSize & 3); lVar2 = lVar2 + -1) {
    ans_reorder_fold_encode<7U>::encode_symbol
              (&local_a8,&local_d0,src[srcSize + lVar2 + -1],(uint8_t **)&local_d8);
  }
  for (uVar3 = srcSize & 0xfffffffffffffffc; uVar3 != 0; uVar3 = uVar3 - 4) {
    ans_reorder_fold_encode<7U>::encode_symbol
              (&local_a8,&local_d0,src[uVar3 - 1],(uint8_t **)&local_d8);
    ans_reorder_fold_encode<7U>::encode_symbol
              (&local_a8,&uStack_c8,src[uVar3 - 2],(uint8_t **)&local_d8);
    ans_reorder_fold_encode<7U>::encode_symbol
              (&local_a8,&uStack_c0,src[uVar3 - 3],(uint8_t **)&local_d8);
    ans_reorder_fold_encode<7U>::encode_symbol
              (&local_a8,&uStack_b8,src[uVar3 - 4],(uint8_t **)&local_d8);
  }
  *local_d8 = local_d0 - local_a8.lower_bound;
  local_d8[1] = uStack_c8 - local_a8.lower_bound;
  local_d8[2] = uStack_c0 - local_a8.lower_bound;
  local_d8[3] = uStack_b8 - local_a8.lower_bound;
  sVar1 = (long)local_d8 + (0x20 - (long)local_b0);
  ans_reorder_fold_encode<7U>::~ans_reorder_fold_encode(&local_a8);
  return sVar1;
}

Assistant:

size_t ans_reorder_fold_compress(
    uint8_t* dst, size_t dstCapacity, const uint32_t* src, size_t srcSize)
{
    auto in_u32 = reinterpret_cast<const uint32_t*>(src);
    auto ans_frame = ans_reorder_fold_encode<fidelity>::create(in_u32, srcSize);
    uint8_t* out_u8 = reinterpret_cast<uint8_t*>(dst);

    // serialize model
    ans_frame.serialize(out_u8);

    // start encoding
    std::array<uint64_t, 4> states;
    states[0] = ans_frame.initial_state();
    states[1] = ans_frame.initial_state();
    states[2] = ans_frame.initial_state();
    states[3] = ans_frame.initial_state();

    size_t cur_sym = 0;
    while ((srcSize - cur_sym) % 4 != 0) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        cur_sym += 1;
    }
    while (cur_sym != srcSize) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        ans_frame.encode_symbol(
            states[1], in_u32[srcSize - cur_sym - 2], out_u8);
        ans_frame.encode_symbol(
            states[2], in_u32[srcSize - cur_sym - 3], out_u8);
        ans_frame.encode_symbol(
            states[3], in_u32[srcSize - cur_sym - 4], out_u8);
        cur_sym += 4;
    }

    // flush final state
    ans_frame.flush_state(states[0], out_u8);
    ans_frame.flush_state(states[1], out_u8);
    ans_frame.flush_state(states[2], out_u8);
    ans_frame.flush_state(states[3], out_u8);

    return out_u8 - reinterpret_cast<uint8_t*>(dst);
}